

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void js_promise_finalizer(JSRuntime *rt,JSValue val)

{
  void *pvVar1;
  JSPromiseReactionData *pJVar2;
  JSPromiseReactionData *rd;
  long lVar3;
  
  if ((((int)val.tag == -1) && (*(short *)((long)val.u.ptr + 6) == 0x2a)) &&
     (pvVar1 = *(void **)((long)val.u.ptr + 0x30), pvVar1 != (void *)0x0)) {
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      rd = *(JSPromiseReactionData **)((long)pvVar1 + lVar3 * 0x10 + 0x10);
      while (rd != (JSPromiseReactionData *)((long)pvVar1 + lVar3 * 0x10 + 8)) {
        pJVar2 = (JSPromiseReactionData *)(rd->link).next;
        promise_reaction_data_free(rt,rd);
        rd = pJVar2;
      }
    }
    JS_FreeValueRT(rt,*(JSValue *)((long)pvVar1 + 0x30));
    (*(rt->mf).js_free)(&rt->malloc_state,pvVar1);
    return;
  }
  return;
}

Assistant:

static void js_promise_finalizer(JSRuntime *rt, JSValue val)
{
    JSPromiseData *s = JS_GetOpaque(val, JS_CLASS_PROMISE);
    struct list_head *el, *el1;
    int i;

    if (!s)
        return;
    for(i = 0; i < 2; i++) {
        list_for_each_safe(el, el1, &s->promise_reactions[i]) {
            JSPromiseReactionData *rd =
                list_entry(el, JSPromiseReactionData, link);
            promise_reaction_data_free(rt, rd);
        }
    }
    JS_FreeValueRT(rt, s->promise_result);
    js_free_rt(rt, s);
}